

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O1

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::run
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this)

{
  RABlock **item;
  int iVar1;
  uint uVar2;
  FuncNode *pFVar3;
  RABlock *pRVar4;
  BaseRAPass *pBVar5;
  RABlock *this_00;
  InstControlFlow IVar6;
  Error EVar7;
  Error EVar8;
  Error EVar9;
  RABlock *pRVar10;
  undefined8 extraout_RAX;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  Error EVar14;
  uint uVar15;
  uint *puVar16;
  InvokeNode *initialNode;
  char cVar17;
  InvokeNode *pIVar18;
  bool bVar19;
  bool bVar20;
  char cVar21;
  float in_XMM0_Da;
  InstControlFlow cf;
  LabelNode *labelNode;
  ZoneVector<asmjit::v1_14::RABlock_*> blocksWithUnknownJumps;
  InstControlFlow local_10b4;
  Error local_10b0;
  undefined4 uStack_10ac;
  uint64_t local_10a8;
  long local_10a0;
  long local_1098;
  RABlock *local_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined4 local_1070;
  undefined8 local_106c;
  undefined8 uStack_1064;
  undefined8 local_105c;
  undefined8 uStack_1054;
  undefined4 local_104c;
  undefined8 local_1048;
  undefined8 uStack_1040;
  uint *local_1038;
  uint local_1030 [3];
  byte local_1022 [4082];
  
  if (this->_logger != (Logger *)0x0) {
    Logger::logf(this->_logger,in_XMM0_Da);
  }
  EVar7 = prepare(this);
  if (EVar7 == 0) {
    if (this->_logger != (Logger *)0x0) {
      _logNode(this,(BaseNode *)this->_funcNode,2,(char *)0x0);
    }
    if (this->_logger != (Logger *)0x0) {
      _logBlock(this,this->_curBlock,2);
    }
    pFVar3 = this->_funcNode;
    pIVar18 = *(InvokeNode **)&pFVar3->field_0x8;
    if (pIVar18 == (InvokeNode *)0x0) {
LAB_0014cfd4:
      EVar7 = 3;
    }
    else {
      item = &this->_curBlock;
      local_1090 = this->_curBlock;
      *(FuncNode **)(local_1090 + 0x10) = pFVar3;
      *(FuncNode **)(local_1090 + 0x18) = pFVar3;
      local_1070 = 0xffffffff;
      local_106c = 0;
      uStack_1064 = 0;
      local_105c = 0;
      uStack_1054 = 0;
      local_104c = 0;
      local_1048 = 0;
      uStack_1040 = 0;
      local_1038 = local_1030;
      local_1088 = 0;
      uStack_1080 = 0;
      EVar8 = EVar7;
      do {
        iVar1 = *(int *)&pIVar18->field_0x14;
        if (1 < iVar1 + 1U) {
LAB_0014cfad:
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                     ,0x60,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = *(InvokeNode **)&pIVar18->field_0x8;
        EVar9 = EVar7;
        if ((pIVar18->field_0x11 & 0x20) != 0) {
          if (*item == (RABlock *)0x0) {
            removeNode(this,(BaseNode *)pIVar18);
            cVar21 = '\x05';
            pIVar18 = initialNode;
            goto LAB_0014ca47;
          }
          this->_hasCode = true;
          if ((byte)(pIVar18->field_0x10 - 0x11) < 2) {
            if (iVar1 == -1) {
              *(undefined4 *)&pIVar18->field_0x14 = 0;
            }
            else {
              lVar13 = *(long *)pIVar18;
              if (pIVar18->field_0x10 == '\x12') {
                EVar8 = x86::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,pIVar18);
              }
              else {
                EVar8 = x86::RACFGBuilder::onBeforeRet((RACFGBuilder *)this,(FuncRetNode *)pIVar18);
              }
              if (EVar8 == 0) {
                if (lVar13 != *(long *)pIVar18) {
                  if (*(InvokeNode **)(*item + 0x10) == pIVar18) {
                    *(undefined8 *)(*item + 0x10) = *(undefined8 *)(lVar13 + 8);
                  }
                  *(undefined4 *)&pIVar18->field_0x14 = 0xffffffff;
                  pIVar18 = *(InvokeNode **)(lVar13 + 8);
                  if ((pIVar18->field_0x11 & 0x20) == 0) goto LAB_0014cfcf;
                }
                initialNode = *(InvokeNode **)&pIVar18->field_0x8;
                bVar20 = true;
                EVar8 = EVar7;
              }
              else {
                bVar20 = false;
              }
              cVar21 = '\x01';
              EVar9 = EVar8;
              if (!bVar20) goto LAB_0014ca47;
            }
          }
          if (this->_logger != (Logger *)0x0) {
            _logNode(this,(BaseNode *)pIVar18,4,(char *)0x0);
          }
          local_10b4 = kRegular;
          local_1070 = *(undefined4 *)(this->_curBlock + 8);
          local_104c = 0;
          local_105c = 0;
          uStack_1054 = 0;
          local_106c = 0;
          uStack_1064 = 0;
          local_1048 = 0;
          uStack_1040 = 0;
          local_1038 = local_1030;
          EVar7 = x86::RACFGBuilder::onInst
                            ((RACFGBuilder *)this,(InstNode *)pIVar18,&local_10b4,
                             (RAInstBuilder *)&local_1070);
          cVar17 = '\x01';
          cVar21 = cVar17;
          if ((EVar7 == 0) &&
             ((pIVar18->field_0x10 != '\x12' ||
              (EVar7 = x86::RACFGBuilder::onInvoke
                                 ((RACFGBuilder *)this,pIVar18,(RAInstBuilder *)&local_1070),
              EVar7 == 0)))) {
            if (pIVar18->field_0x10 == '\x11') {
              EVar7 = x86::RACFGBuilder::onRet
                                ((RACFGBuilder *)this,(FuncRetNode *)pIVar18,
                                 (RAInstBuilder *)&local_1070);
              if (EVar7 != 0) goto LAB_0014c969;
              local_10b4 = kMaxValue;
            }
            if ((local_10b4 == kJump) && (local_1030 != local_1038)) {
              pBVar5 = this->_pass;
              pRVar10 = this->_curBlock;
              uVar15 = 0;
              puVar16 = local_1030;
              do {
                if (*(uint *)&pBVar5->field_0x148 <= *puVar16) {
                  run();
                  goto LAB_0014cfad;
                }
                if ((*(byte *)(*(long *)(*(long *)&pBVar5->_workRegs + (ulong)*puVar16 * 8) + 0x21)
                    & 0xf) == 0) {
                  bVar11 = *(byte *)((long)puVar16 + 0xe);
                  if (bVar11 == 0xff) {
                    if (1 < uVar15) {
                      run();
                      goto LAB_0014cfca;
                    }
                    uVar12 = (ulong)uVar15;
                    uVar15 = uVar15 + 1;
                    bVar11 = (pBVar5->_scratchRegIndexes)._data[uVar12];
                    *(byte *)((long)puVar16 + 0xe) = bVar11;
                  }
                  *(uint *)(pRVar10 + 0xc0) = *(uint *)(pRVar10 + 0xc0) | 1 << (bVar11 & 0x1f);
                }
                puVar16 = puVar16 + 8;
              } while (puVar16 != local_1038);
            }
            EVar7 = BaseRAPass::assignRAInst
                              (this->_pass,(BaseNode *)pIVar18,this->_curBlock,
                               (RAInstBuilder *)&local_1070);
            IVar6 = local_10b4;
            if (EVar7 == 0) {
              uVar15 = (this->_blockRegStats)._packed | (uint)local_105c;
              (this->_blockRegStats)._packed = uVar15;
              if (local_10b4 != kRegular) {
                if (local_10b4 < kCall) {
                  pRVar10 = *item;
                  *(InvokeNode **)(pRVar10 + 0x18) = pIVar18;
                  uVar2 = *(uint *)(pRVar10 + 0xc);
                  *(uint *)(pRVar10 + 0xc) = uVar2 | 0x101;
                  *(uint *)(pRVar10 + 0x30) = *(uint *)(pRVar10 + 0x30) | uVar15;
                  if ((pIVar18->field_0x34 & 2) == 0) {
                    if (pIVar18->field_0x12 == 0) {
                      cVar21 = '\x01';
                      EVar8 = 3;
                    }
                    else {
                      lVar13 = (ulong)((byte)pIVar18->field_0x12 - 1) * 0x10;
                      if ((*(uint *)(&pIVar18->field_0x40 + lVar13) & 7) == 5) {
                        EVar7 = BaseBuilder::labelNodeOf
                                          (&this->_cc->super_BaseBuilder,(LabelNode **)&local_10b0,
                                           *(uint32_t *)(&pIVar18->field_0x44 + lVar13));
                        if (EVar7 == 0) {
                          bVar20 = false;
                          pRVar10 = BaseRAPass::newBlockOrExistingAt
                                              (this->_pass,
                                               (LabelNode *)CONCAT44(uStack_10ac,local_10b0),
                                               (BaseNode **)0x0);
                          if (pRVar10 == (RABlock *)0x0) {
                            EVar7 = 1;
                          }
                          else {
                            pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 4);
                            EVar9 = RABlock::appendSuccessor(*item,pRVar10);
                            bVar20 = EVar9 == 0;
                            EVar7 = EVar8;
                            if (!bVar20) {
                              EVar7 = EVar9;
                            }
                          }
                        }
                        else {
                          bVar20 = false;
                        }
                        cVar21 = '\x01';
                        EVar8 = EVar7;
                        if (bVar20) {
LAB_0014cda3:
                          cVar21 = '\0';
                          EVar8 = EVar7;
                        }
                      }
                      else {
                        *(uint *)(pRVar10 + 0xc) = uVar2 | 0x501;
                        if (pIVar18->field_0x10 == '\x0f') {
                          lVar13 = *(long *)&pIVar18->_funcDetail;
                        }
                        else {
                          lVar13 = 0;
                        }
                        pBVar5 = this->_pass;
                        if (lVar13 == 0) {
                          EVar7 = ZoneVector<asmjit::v1_14::RABlock_*>::append
                                            ((ZoneVector<asmjit::v1_14::RABlock_*> *)&local_1088,
                                             &pBVar5->_allocator,item);
                          cVar21 = '\x01';
                          if (EVar7 == 0) goto LAB_0014cd9d;
                        }
                        else {
                          local_10a8 = pBVar5->_lastTimestamp + 1;
                          pBVar5->_lastTimestamp = local_10a8;
                          bVar20 = (ulong)*(uint *)(lVar13 + 0x18) == 0;
                          if (!bVar20) {
                            local_1098 = *(long *)(lVar13 + 0x10);
                            local_10a0 = (ulong)*(uint *)(lVar13 + 0x18) << 2;
                            lVar13 = 0;
                            do {
                              EVar7 = BaseBuilder::labelNodeOf
                                                (&this->_cc->super_BaseBuilder,
                                                 (LabelNode **)&local_10b0,
                                                 *(uint32_t *)(local_1098 + lVar13));
                              if (EVar7 == 0) {
                                pRVar10 = BaseRAPass::newBlockOrExistingAt
                                                    (this->_pass,
                                                     (LabelNode *)CONCAT44(uStack_10ac,local_10b0),
                                                     (BaseNode **)0x0);
                                if (pRVar10 == (RABlock *)0x0) {
                                  EVar7 = 1;
                                  goto LAB_0014cc7f;
                                }
                                bVar19 = true;
                                if (*(uint64_t *)(pRVar10 + 0x48) != local_10a8) {
                                  *(uint64_t *)(pRVar10 + 0x48) = local_10a8;
                                  pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 4);
                                  EVar7 = RABlock::appendSuccessor(*item,pRVar10);
                                  bVar19 = EVar7 == 0;
                                  if (!bVar19) {
                                    EVar8 = EVar7;
                                  }
                                }
                              }
                              else {
LAB_0014cc7f:
                                bVar19 = false;
                                EVar8 = EVar7;
                              }
                              if (!bVar19) {
                                cVar21 = '\x01';
                                goto LAB_0014cd78;
                              }
                              lVar13 = lVar13 + 4;
                              bVar20 = local_10a0 == lVar13;
                            } while (!bVar20);
                          }
                          cVar21 = '\x1c';
LAB_0014cd78:
                          EVar7 = EVar8;
                          if (bVar20) {
                            EVar8 = shareAssignmentAcrossSuccessors(this,this->_curBlock);
                            cVar21 = EVar8 != 0;
                            if ((bool)cVar21) {
                              EVar7 = EVar8;
                            }
                          }
                          EVar8 = EVar7;
                          if (cVar21 == '\0') {
LAB_0014cd9d:
                            EVar7 = EVar8;
                            cVar21 = '\0';
                          }
                        }
                        EVar8 = EVar7;
                        if (cVar21 == '\0') goto LAB_0014cda3;
                      }
                    }
                    EVar7 = EVar8;
                    if (cVar21 != '\0') goto LAB_0014c969;
                  }
                  if (IVar6 != kJump) {
                    pIVar18 = initialNode;
                    if (initialNode == (InvokeNode *)0x0) {
                      EVar7 = 3;
                      cVar21 = cVar17;
                      goto LAB_0014c969;
                    }
                    if (initialNode->field_0x10 == '\x03') {
                      pRVar10 = *(RABlock **)&initialNode->field_0x20;
                      if (pRVar10 == (RABlock *)0x0) {
                        pRVar10 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
                        if (pRVar10 == (RABlock *)0x0) goto LAB_0014cf41;
                        *(RABlock **)&initialNode->field_0x20 = pRVar10;
                      }
                    }
                    else {
                      pRVar10 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
                      if (pRVar10 == (RABlock *)0x0) {
LAB_0014cf41:
                        EVar7 = 1;
                        cVar21 = '\x01';
                        goto LAB_0014c969;
                      }
                    }
                    this_00 = *item;
                    pRVar4 = this_00 + 0xc;
                    *(uint *)pRVar4 = *(uint *)pRVar4 | 0x200;
                    EVar7 = RABlock::prependSuccessor(this_00,pRVar10);
                    cVar21 = cVar17;
                    if (EVar7 == 0) {
                      this->_curBlock = pRVar10;
                      this->_hasCode = false;
                      (this->_blockRegStats)._packed = 0;
                      if (((byte)pRVar10[0xc] & 1) == 0) {
                        EVar7 = BaseRAPass::addBlock(this->_pass,pRVar10);
                        if ((EVar7 == 0) &&
                           (EVar7 = EVar8, cVar21 = '\x05', this->_logger != (Logger *)0x0)) {
                          _logBlock(this,this->_curBlock,2);
                        }
                      }
                      else {
                        EVar7 = EVar8;
                        cVar21 = '\x04';
                      }
                    }
                    goto LAB_0014c969;
                  }
                  *item = (RABlock *)0x0;
                }
                if (IVar6 == kMaxValue) {
                  pRVar10 = this->_curBlock;
                  *(InvokeNode **)(pRVar10 + 0x18) = pIVar18;
                  pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 1);
                  *(uint *)(pRVar10 + 0x30) =
                       *(uint *)(pRVar10 + 0x30) | (this->_blockRegStats)._packed;
                  EVar7 = RABlock::appendSuccessor(pRVar10,this->_retBlock);
                  cVar21 = cVar17;
                  if (EVar7 != 0) goto LAB_0014c969;
                  *item = (RABlock *)0x0;
                }
              }
              EVar7 = EVar8;
              cVar21 = '\0';
            }
          }
LAB_0014c969:
          EVar9 = EVar7;
          EVar8 = EVar7;
          if (cVar21 != '\0') goto LAB_0014ca47;
          goto LAB_0014ca38;
        }
        if (pIVar18->field_0x10 == '\x03') {
          pRVar10 = *item;
          pRVar4 = *(RABlock **)&pIVar18->field_0x20;
          if (pRVar10 != (RABlock *)0x0) {
            if (pRVar4 == (RABlock *)0x0) {
              if ((pRVar10 == local_1090 | this->_hasCode) == 1) {
                if (*(InvokeNode **)(pRVar10 + 0x18) == pIVar18) {
                  run();
                  __clang_call_terminate(extraout_RAX);
                }
                *(undefined8 *)(pRVar10 + 0x18) = *(undefined8 *)pIVar18;
                *(uint *)(pRVar10 + 0xc) = *(uint *)(pRVar10 + 0xc) | 0x201;
                *(uint *)(pRVar10 + 0x30) =
                     *(uint *)(pRVar10 + 0x30) | (this->_blockRegStats)._packed;
                pRVar10 = BaseRAPass::newBlock(this->_pass,(BaseNode *)pIVar18);
                cVar21 = '\x01';
                if (pRVar10 == (RABlock *)0x0) {
                  bVar20 = false;
                  EVar7 = 1;
                }
                else {
                  pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 4);
                  EVar8 = RABlock::appendSuccessor(*item,pRVar10);
                  if ((EVar8 == 0) &&
                     (EVar8 = BaseRAPass::addBlock(this->_pass,pRVar10), EVar8 == 0)) {
                    this->_curBlock = pRVar10;
                    this->_hasCode = false;
                    (this->_blockRegStats)._packed = 0;
                    bVar20 = true;
                  }
                  else {
                    bVar20 = false;
                    EVar7 = EVar8;
                  }
                }
                EVar9 = EVar7;
                EVar8 = EVar7;
                if (!bVar20) goto LAB_0014ca47;
              }
              *(RABlock **)&pIVar18->field_0x20 = *item;
              EVar14 = EVar8;
            }
            else {
              pRVar4[0xc] = (RABlock)((byte)pRVar4[0xc] | 4);
              if (pRVar10 == pRVar4) {
                bVar20 = true;
                if (this->_hasCode == true) {
                  EVar8 = 3;
LAB_0014c6d7:
                  EVar7 = EVar8;
                  bVar20 = false;
                  EVar8 = EVar7;
                }
              }
              else {
                if (*(InvokeNode **)(pRVar10 + 0x18) == pIVar18) {
LAB_0014cfca:
                  run();
LAB_0014cfcf:
                  run();
                  goto LAB_0014cfd4;
                }
                *(undefined8 *)(pRVar10 + 0x18) = *(undefined8 *)pIVar18;
                *(uint *)(pRVar10 + 0xc) = *(uint *)(pRVar10 + 0xc) | 0x201;
                *(uint *)(pRVar10 + 0x30) =
                     *(uint *)(pRVar10 + 0x30) | (this->_blockRegStats)._packed;
                EVar8 = RABlock::appendSuccessor(pRVar10,pRVar4);
                if ((EVar8 != 0) || (EVar8 = BaseRAPass::addBlock(this->_pass,pRVar4), EVar8 != 0))
                goto LAB_0014c6d7;
                this->_curBlock = pRVar4;
                this->_hasCode = false;
                (this->_blockRegStats)._packed = 0;
                bVar20 = true;
                EVar8 = EVar7;
              }
              cVar21 = '\x01';
              EVar9 = EVar7;
              EVar14 = EVar8;
              if (!bVar20) goto LAB_0014ca47;
            }
LAB_0014c9ef:
            pRVar10 = this->_curBlock;
            if (((pRVar10 != (RABlock *)0x0) && (pRVar10 != this->_lastLoggedBlock)) &&
               (this->_logger != (Logger *)0x0)) {
              _logBlock(this,pRVar10,2);
            }
            if (this->_logger != (Logger *)0x0) {
              _logNode(this,(BaseNode *)pIVar18,2,(char *)0x0);
            }
            EVar8 = EVar14;
            if (*(uint32_t *)&pIVar18->field_0x30 == this->_exitLabelId) {
              pRVar10 = this->_curBlock;
              *(InvokeNode **)(pRVar10 + 0x18) = pIVar18;
              pRVar10[0xc] = (RABlock)((byte)pRVar10[0xc] | 1);
              *(uint *)(pRVar10 + 0x30) = *(uint *)(pRVar10 + 0x30) | (this->_blockRegStats)._packed
              ;
              EVar8 = BaseRAPass::addExitBlock(this->_pass,pRVar10);
              cVar21 = '\x01';
              EVar9 = EVar8;
              if (EVar8 != 0) goto LAB_0014ca47;
              *item = (RABlock *)0x0;
              EVar8 = EVar7;
            }
            goto LAB_0014ca38;
          }
          *item = pRVar4;
          if (pRVar4 == (RABlock *)0x0) {
            pRVar10 = BaseRAPass::newBlock(this->_pass,(BaseNode *)pIVar18);
            this->_curBlock = pRVar10;
            if (pRVar10 != (RABlock *)0x0) {
              *(RABlock **)&pIVar18->field_0x20 = pRVar10;
              goto LAB_0014c9b8;
            }
            cVar21 = '\x01';
            EVar9 = 1;
            EVar8 = 1;
          }
          else {
            cVar21 = '\x04';
            if (((byte)pRVar4[0xc] & 1) == 0) {
LAB_0014c9b8:
              pRVar4 = this->_curBlock;
              pRVar10 = pRVar4 + 0xc;
              *(uint *)pRVar10 = *(uint *)pRVar10 | 4;
              this->_hasCode = false;
              (this->_blockRegStats)._packed = 0;
              EVar8 = BaseRAPass::addBlock(this->_pass,pRVar4);
              cVar21 = '\x01';
              EVar9 = EVar8;
              EVar14 = EVar7;
              if (EVar8 == 0) goto LAB_0014c9ef;
            }
          }
        }
        else {
          if (this->_logger != (Logger *)0x0) {
            _logNode(this,(BaseNode *)pIVar18,4,(char *)0x0);
          }
          if (pIVar18->field_0x10 == '\n') {
            if (pIVar18 == (InvokeNode *)this->_funcNode->_end) {
              cVar21 = '\x04';
              if ((this->_curBlock == (RABlock *)0x0) || ((this->_hasCode & 1U) == 0))
              goto LAB_0014ca47;
LAB_0014c783:
              cVar21 = '\x01';
              EVar9 = 3;
              EVar8 = 3;
              goto LAB_0014ca47;
            }
          }
          else if ((pIVar18->field_0x10 == '\x10') && (pIVar18 != (InvokeNode *)this->_funcNode))
          goto LAB_0014c783;
LAB_0014ca38:
          cVar21 = '\0';
          pIVar18 = initialNode;
          EVar9 = EVar7;
          if (initialNode == (InvokeNode *)0x0) {
            EVar8 = 3;
            cVar21 = '\x01';
            EVar9 = 3;
          }
        }
LAB_0014ca47:
        EVar7 = EVar9;
      } while ((cVar21 == '\0') || (cVar21 == '\x05'));
      if ((cVar21 == '\x04') &&
         (EVar7 = 3, this->_pass->_createdBlockCount == *(uint32_t *)&this->_pass->field_0xb8)) {
        run();
        EVar7 = local_10b0;
      }
    }
  }
  return EVar7;
}

Assistant:

Error run() noexcept {
    log("[BuildCFG]\n");
    ASMJIT_PROPAGATE(prepare());

    logNode(_funcNode, kRootIndentation);
    logBlock(_curBlock, kRootIndentation);

    RABlock* entryBlock = _curBlock;
    BaseNode* node = _funcNode->next();

    if (ASMJIT_UNLIKELY(!node)) {
      return DebugUtils::errored(kErrorInvalidState);
    }

    _curBlock->setFirst(_funcNode);
    _curBlock->setLast(_funcNode);

    RAInstBuilder ib;
    ZoneVector<RABlock*> blocksWithUnknownJumps;

    for (;;) {
      BaseNode* next = node->next();
      ASMJIT_ASSERT(node->position() == 0 || node->position() == kNodePositionDidOnBefore);

      if (node->isInst()) {
        // Instruction | Jump | Invoke | Return
        // ------------------------------------

        // Handle `InstNode`, `InvokeNode`, and `FuncRetNode`. All of them share the same interface that provides
        // operands that have read/write semantics.
        if (ASMJIT_UNLIKELY(!_curBlock)) {
          // Unreachable code has to be removed, we cannot allocate registers in such code as we cannot do proper
          // liveness analysis in such case.
          removeNode(node);
          node = next;
          continue;
        }

        _hasCode = true;

        if (node->isInvoke() || node->isFuncRet()) {
          if (node->position() != kNodePositionDidOnBefore) {
            // Call and Reg are complicated as they may insert some surrounding code around them. The simplest
            // approach is to get the previous node, call the `onBefore()` handlers and then check whether
            // anything changed and restart if so. By restart we mean that the current `node` would go back to
            // the first possible inserted node by `onBeforeInvoke()` or `onBeforeRet()`.
            BaseNode* prev = node->prev();

            if (node->type() == NodeType::kInvoke) {
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeInvoke(node->as<InvokeNode>()));
            }
            else {
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeRet(node->as<FuncRetNode>()));
            }

            if (prev != node->prev()) {
              // If this was the first node in the block and something was
              // inserted before it then we have to update the first block.
              if (_curBlock->first() == node) {
                _curBlock->setFirst(prev->next());
              }

              node->setPosition(kNodePositionDidOnBefore);
              node = prev->next();

              // `onBeforeInvoke()` and `onBeforeRet()` can only insert instructions.
              ASMJIT_ASSERT(node->isInst());
            }

            // Necessary if something was inserted after `node`, but nothing before.
            next = node->next();
          }
          else {
            // Change the position back to its original value.
            node->setPosition(0);
          }
        }

        InstNode* inst = node->as<InstNode>();
        logNode(inst, kCodeIndentation);

        InstControlFlow cf = InstControlFlow::kRegular;
        ib.reset(_curBlock->blockId());
        ASMJIT_PROPAGATE(static_cast<This*>(this)->onInst(inst, cf, ib));

        if (node->isInvoke()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onInvoke(inst->as<InvokeNode>(), ib));
        }

        if (node->isFuncRet()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onRet(inst->as<FuncRetNode>(), ib));
          cf = InstControlFlow::kReturn;
        }

        if (cf == InstControlFlow::kJump) {
          uint32_t fixedRegCount = 0;
          for (RATiedReg& tiedReg : ib) {
            RAWorkReg* workReg = _pass->workRegById(tiedReg.workId());
            if (workReg->group() == RegGroup::kGp) {
              uint32_t useId = tiedReg.useId();
              if (useId == BaseReg::kIdBad) {
                useId = _pass->_scratchRegIndexes[fixedRegCount++];
                tiedReg.setUseId(useId);
              }
              _curBlock->addExitScratchGpRegs(Support::bitMask(useId));
            }
          }
        }

        ASMJIT_PROPAGATE(_pass->assignRAInst(inst, _curBlock, ib));
        _blockRegStats.combineWith(ib._stats);

        if (cf != InstControlFlow::kRegular) {
          // Support for conditional and unconditional jumps.
          if (cf == InstControlFlow::kJump || cf == InstControlFlow::kBranch) {
            _curBlock->setLast(node);
            _curBlock->addFlags(RABlockFlags::kHasTerminator);
            _curBlock->makeConstructed(_blockRegStats);

            if (!inst->hasOption(InstOptions::kUnfollow)) {
              // Jmp/Jcc/Call/Loop/etc...
              uint32_t opCount = inst->opCount();
              const Operand* opArray = inst->operands();

              // Cannot jump anywhere without operands.
              if (ASMJIT_UNLIKELY(!opCount)) {
                return DebugUtils::errored(kErrorInvalidState);
              }

              if (opArray[opCount - 1].isLabel()) {
                // Labels are easy for constructing the control flow.
                LabelNode* labelNode;
                ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, opArray[opCount - 1].as<Label>()));

                RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                if (ASMJIT_UNLIKELY(!targetBlock)) {
                  return DebugUtils::errored(kErrorOutOfMemory);
                }

                targetBlock->makeTargetable();
                ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
              }
              else {
                // Not a label - could be jump with reg/mem operand, which means that it can go anywhere. Such jumps
                // must either be annotated so the CFG can be properly constructed, otherwise we assume the worst case
                // - can jump to any basic block.
                JumpAnnotation* jumpAnnotation = nullptr;
                _curBlock->addFlags(RABlockFlags::kHasJumpTable);

                if (inst->type() == NodeType::kJump) {
                  jumpAnnotation = inst->as<JumpNode>()->annotation();
                }

                if (jumpAnnotation) {
                  uint64_t timestamp = _pass->nextTimestamp();
                  for (uint32_t id : jumpAnnotation->labelIds()) {
                    LabelNode* labelNode;
                    ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, id));

                    RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                    if (ASMJIT_UNLIKELY(!targetBlock)) {
                      return DebugUtils::errored(kErrorOutOfMemory);
                    }

                    // Prevents adding basic-block successors multiple times.
                    if (!targetBlock->hasTimestamp(timestamp)) {
                      targetBlock->setTimestamp(timestamp);
                      targetBlock->makeTargetable();
                      ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
                    }
                  }
                  ASMJIT_PROPAGATE(shareAssignmentAcrossSuccessors(_curBlock));
                }
                else {
                  ASMJIT_PROPAGATE(blocksWithUnknownJumps.append(_pass->allocator(), _curBlock));
                }
              }
            }

            if (cf == InstControlFlow::kJump) {
              // Unconditional jump makes the code after the jump unreachable, which will be removed instantly during
              // the CFG construction; as we cannot allocate registers for instructions that are not part of any block.
              // Of course we can leave these instructions as they are, however, that would only postpone the problem
              // as assemblers can't encode instructions that use virtual registers.
              _curBlock = nullptr;
            }
            else {
              node = next;
              if (ASMJIT_UNLIKELY(!node))
                return DebugUtils::errored(kErrorInvalidState);

              RABlock* consecutiveBlock;
              if (node->type() == NodeType::kLabel) {
                if (node->hasPassData()) {
                  consecutiveBlock = node->passData<RABlock>();
                }
                else {
                  consecutiveBlock = _pass->newBlock(node);
                  if (ASMJIT_UNLIKELY(!consecutiveBlock)) {
                    return DebugUtils::errored(kErrorOutOfMemory);
                  }
                  node->setPassData<RABlock>(consecutiveBlock);
                }
              }
              else {
                consecutiveBlock = _pass->newBlock(node);
                if (ASMJIT_UNLIKELY(!consecutiveBlock)) {
                  return DebugUtils::errored(kErrorOutOfMemory);
                }
              }

              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              ASMJIT_PROPAGATE(_curBlock->prependSuccessor(consecutiveBlock));

              _curBlock = consecutiveBlock;
              _hasCode = false;
              _blockRegStats.reset();

              if (_curBlock->isConstructed())
                break;
              ASMJIT_PROPAGATE(_pass->addBlock(consecutiveBlock));

              logBlock(_curBlock, kRootIndentation);
              continue;
            }
          }

          if (cf == InstControlFlow::kReturn) {
            _curBlock->setLast(node);
            _curBlock->makeConstructed(_blockRegStats);
            ASMJIT_PROPAGATE(_curBlock->appendSuccessor(_retBlock));

            _curBlock = nullptr;
          }
        }
      }
      else if (node->type() == NodeType::kLabel) {
        // Label - Basic-Block Management
        // ------------------------------

        if (!_curBlock) {
          // If the current code is unreachable the label makes it reachable again. We may remove the whole block in
          // the future if it's not referenced though.
          _curBlock = node->passData<RABlock>();

          if (_curBlock) {
            // If the label has a block assigned we can either continue with it or skip it if the block has been
            // constructed already.
            if (_curBlock->isConstructed()) {
              break;
            }
          }
          else {
            // No block assigned - create a new one and assign it.
            _curBlock = _pass->newBlock(node);
            if (ASMJIT_UNLIKELY(!_curBlock)) {
              return DebugUtils::errored(kErrorOutOfMemory);
            }
            node->setPassData<RABlock>(_curBlock);
          }

          _curBlock->makeTargetable();
          _hasCode = false;
          _blockRegStats.reset();
          ASMJIT_PROPAGATE(_pass->addBlock(_curBlock));
        }
        else {
          if (node->hasPassData()) {
            RABlock* consecutive = node->passData<RABlock>();
            consecutive->makeTargetable();

            if (_curBlock == consecutive) {
              // The label currently processed is part of the current block. This is only possible for multiple labels
              // that are right next to each other or labels that are separated by non-code nodes like directives and
              // comments.
              if (ASMJIT_UNLIKELY(_hasCode)) {
                return DebugUtils::errored(kErrorInvalidState);
              }
            }
            else {
              // Label makes the current block constructed. There is a chance that the Label is not used, but we don't
              // know that at this point. In the worst case there would be two blocks next to each other, it's just fine.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }
          }
          else {
            // First time we see this label.
            if (_hasCode || _curBlock == entryBlock) {
              // Cannot continue the current block if it already contains some code or it's a block entry. We need to
              // create a new block and make it a successor.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              RABlock* consecutive = _pass->newBlock(node);
              if (ASMJIT_UNLIKELY(!consecutive)) {
                return DebugUtils::errored(kErrorOutOfMemory);
              }
              consecutive->makeTargetable();

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }

            node->setPassData<RABlock>(_curBlock);
          }
        }

        if (_curBlock && _curBlock != _lastLoggedBlock) {
          logBlock(_curBlock, kRootIndentation);
        }
        logNode(node, kRootIndentation);

        // Unlikely: Assume that the exit label is reached only once per function.
        if (ASMJIT_UNLIKELY(node->as<LabelNode>()->labelId() == _exitLabelId)) {
          _curBlock->setLast(node);
          _curBlock->makeConstructed(_blockRegStats);
          ASMJIT_PROPAGATE(_pass->addExitBlock(_curBlock));

          _curBlock = nullptr;
        }
      }
      else {
        // Other Nodes | Function Exit
        // ---------------------------

        logNode(node, kCodeIndentation);

        if (node->type() == NodeType::kSentinel) {
          if (node == _funcNode->endNode()) {
            // Make sure we didn't flow here if this is the end of the function sentinel.
            if (ASMJIT_UNLIKELY(_curBlock && _hasCode))
              return DebugUtils::errored(kErrorInvalidState);
            break;
          }
        }
        else if (node->type() == NodeType::kFunc) {
          // RAPass can only compile a single function at a time. If we
          // encountered a function it must be the current one, bail if not.
          if (ASMJIT_UNLIKELY(node != _funcNode))
            return DebugUtils::errored(kErrorInvalidState);
          // PASS if this is the first node.
        }
        else {
          // PASS if this is a non-interesting or unknown node.
        }
      }

      // Advance to the next node.
      node = next;

      // NOTE: We cannot encounter a NULL node, because every function must be terminated by a sentinel (`stop`)
      // node. If we encountered a NULL node it means that something went wrong and this node list is corrupted;
      // bail in such case.
      if (ASMJIT_UNLIKELY(!node))
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (_pass->hasDanglingBlocks())
      return DebugUtils::errored(kErrorInvalidState);

    for (RABlock* block : blocksWithUnknownJumps)
      handleBlockWithUnknownJump(block);

    return _pass->initSharedAssignments(_sharedAssignmentsMap);
  }